

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::BindProgramResources(DeviceContextGLImpl *this,Uint32 BindSRBMask)

{
  ShaderResourceCacheGL *this_00;
  TextureBaseGL *pTVar1;
  BufferGLImpl *pBVar2;
  bool bVar3;
  Uint32 UVar4;
  Uint32 UVar5;
  Char *pCVar6;
  PipelineStateGLImpl *pPVar7;
  TBindings *BaseBindings_00;
  reference pvVar8;
  reference ppSVar9;
  GLContextState *pGVar10;
  reference ppTVar11;
  reference ppBVar12;
  char (*in_RCX) [32];
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *in_R8;
  MEMORY_BARRIER BufferMemoryBarriers;
  BufferGLImpl *pWritableBuff;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *__range1_1;
  MEMORY_BARRIER TextureMemBarriers;
  TextureBaseGL *pWritableTex;
  iterator __end1;
  iterator __begin1;
  vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *__range1;
  string msg_6;
  string msg_5;
  string msg_4;
  ShaderResourceCacheImplType *pResourceCache;
  TBindings *BaseBindings;
  string msg_3;
  Uint32 sign;
  Uint32 SignBit;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 BindSRBMask_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._12_4_ = BindSRBMask;
  if (BindSRBMask == 0) {
    FormatString<char[26],char[17]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BindSRBMask != 0",(char (*) [17])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x2b2;
    DebugAssertionFailed
              (pCVar6,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b2);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar3 = std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>::empty
                    (&this->m_BoundWritableTextures);
  if (!bVar3) {
    FormatString<char[26],char[32]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableTextures.empty()",in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x2b6;
    DebugAssertionFailed
              (pCVar6,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b6);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar3 = std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>::empty
                    (&this->m_BoundWritableBuffers);
  if (!bVar3) {
    FormatString<char[26],char[31]>
              ((string *)&sign,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableBuffers.empty()",(char (*) [31])in_RCX);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b7);
    std::__cxx11::string::~string((string *)&sign);
  }
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  while (msg.field_2._12_4_ != 0) {
    msg_3.field_2._12_4_ = ExtractLSB<unsigned_int>((uint *)(msg.field_2._M_local_buf + 0xc));
    UVar4 = LinuxMisc::GetLSB(msg_3.field_2._12_4_);
    msg_3.field_2._8_4_ = UVar4;
    pPVar7 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState);
    UVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignatureCount
                      (&pPVar7->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if (UVar5 <= UVar4) {
      FormatString<char[26],char[53]>
                ((string *)&BaseBindings,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"sign < m_pPipelineState->GetResourceSignatureCount()",
                 (char (*) [53])(ulong)UVar5);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"BindProgramResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2bf);
      std::__cxx11::string::~string((string *)&BaseBindings);
    }
    pPVar7 = RefCntAutoPtr<Diligent::PipelineStateGLImpl>::operator->
                       (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState);
    BaseBindings_00 = PipelineStateGLImpl::GetBaseBindings(pPVar7,msg_3.field_2._8_4_);
    pvVar8 = std::array<std::array<unsigned_short,_4UL>,_8UL>::operator[]
                       ((array<std::array<unsigned_short,_4UL>,_8UL> *)
                        &(this->m_BindInfo).super_CommittedShaderResources.field_0xe4,
                        (ulong)(uint)msg_3.field_2._8_4_);
    *(undefined8 *)pvVar8->_M_elems = *(undefined8 *)BaseBindings_00->_M_elems;
    ppSVar9 = std::array<Diligent::ShaderResourceCacheGL_*,_8UL>::operator[]
                        ((array<Diligent::ShaderResourceCacheGL_*,_8UL> *)&this->m_BindInfo,
                         (ulong)(uint)msg_3.field_2._8_4_);
    this_00 = *ppSVar9;
    if (this_00 == (ShaderResourceCacheGL *)0x0) {
      FormatString<char[25],unsigned_int,char[9]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Resource cache at index ",
                 (char (*) [25])((long)&msg_3.field_2 + 8),(uint *)0xe6a6bd,(char (*) [9])in_R8);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"BindProgramResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2c6);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    if (((uint)(this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask & msg_3.field_2._12_4_
        ) == 0) {
      if (((uint)(this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask &
          msg_3.field_2._12_4_) == 0) {
        FormatString<char[104]>
                  ((string *)((long)&msg_6.field_2 + 8),
                   (char (*) [104])
                   "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask()."
                  );
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2cc);
        std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
      }
      bVar3 = ShaderResourceCacheGL::HasDynamicResources(this_00);
      if (!bVar3) {
        FormatString<char[209]>
                  ((string *)&__range1,
                   (char (*) [209])
                   "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources in the cache have changed, but the SRB has not been committed before the draw/dispatch command."
                  );
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2cf);
        std::__cxx11::string::~string((string *)&__range1);
      }
      pGVar10 = GetContextState(this);
      ShaderResourceCacheGL::BindDynamicBuffers(this_00,pGVar10,BaseBindings_00);
    }
    else {
      pGVar10 = GetContextState(this);
      in_R8 = &this->m_BoundWritableBuffers;
      ShaderResourceCacheGL::BindResources
                (this_00,pGVar10,BaseBindings_00,&this->m_BoundWritableTextures,in_R8);
    }
  }
  (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask =
       (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask &
       ((this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask ^ 0xff);
  __end1 = std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>::begin
                     (&this->m_BoundWritableTextures);
  pWritableTex = (TextureBaseGL *)
                 std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>
                 ::end(&this->m_BoundWritableTextures);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Diligent::TextureBaseGL_**,_std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>_>
                                     *)&pWritableTex), bVar3) {
    ppTVar11 = __gnu_cxx::
               __normal_iterator<Diligent::TextureBaseGL_**,_std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>_>
               ::operator*(&__end1);
    pTVar1 = *ppTVar11;
    Diligent::operator|=
              (&this->m_CommittedResourcesTentativeBarriers,MEMORY_BARRIER_ALL_TEXTURE_BARRIERS);
    AsyncWritableResource::SetPendingMemoryBarriers
              (&pTVar1->super_AsyncWritableResource,MEMORY_BARRIER_ALL_TEXTURE_BARRIERS);
    __gnu_cxx::
    __normal_iterator<Diligent::TextureBaseGL_**,_std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>::clear
            (&this->m_BoundWritableTextures);
  __end1_1 = std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>::begin
                       (&this->m_BoundWritableBuffers);
  pWritableBuff =
       (BufferGLImpl *)
       std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>::end
                 (&this->m_BoundWritableBuffers);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Diligent::BufferGLImpl_**,_std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>_>
                             *)&pWritableBuff), bVar3) {
    ppBVar12 = __gnu_cxx::
               __normal_iterator<Diligent::BufferGLImpl_**,_std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>_>
               ::operator*(&__end1_1);
    pBVar2 = *ppBVar12;
    Diligent::operator|=
              (&this->m_CommittedResourcesTentativeBarriers,MEMORY_BARRIER_ALL_BUFFER_BARRIERS);
    AsyncWritableResource::SetPendingMemoryBarriers
              (&pBVar2->super_AsyncWritableResource,MEMORY_BARRIER_ALL_BUFFER_BARRIERS);
    __gnu_cxx::
    __normal_iterator<Diligent::BufferGLImpl_**,_std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>::clear
            (&this->m_BoundWritableBuffers);
  return;
}

Assistant:

void DeviceContextGLImpl::BindProgramResources(Uint32 BindSRBMask)
{
    VERIFY_EXPR(BindSRBMask != 0);
    //if (m_CommittedResourcesTentativeBarriers != 0)
    //    LOG_INFO_MESSAGE("Not all tentative resource barriers have been executed since the last call to CommitShaderResources(). Did you forget to call Draw()/DispatchCompute() ?");

    VERIFY_EXPR(m_BoundWritableTextures.empty());
    VERIFY_EXPR(m_BoundWritableBuffers.empty());

    m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;

    while (BindSRBMask != 0)
    {
        Uint32 SignBit = ExtractLSB(BindSRBMask);
        Uint32 sign    = PlatformMisc::GetLSB(SignBit);
        VERIFY_EXPR(sign < m_pPipelineState->GetResourceSignatureCount());
        const PipelineStateGLImpl::TBindings& BaseBindings = m_pPipelineState->GetBaseBindings(sign);
#ifdef DILIGENT_DEVELOPMENT
        m_BindInfo.BaseBindings[sign] = BaseBindings;
#endif

        const ShaderResourceCacheImplType* pResourceCache = m_BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", sign, " is null");
        if (m_BindInfo.StaleSRBMask & SignBit)
            pResourceCache->BindResources(GetContextState(), BaseBindings, m_BoundWritableTextures, m_BoundWritableBuffers);
        else
        {
            VERIFY((m_BindInfo.DynamicSRBMask & SignBit) != 0,
                   "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask().");
            DEV_CHECK_ERR(pResourceCache->HasDynamicResources(),
                          "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources "
                          "in the cache have changed, but the SRB has not been committed before the draw/dispatch command.");
            pResourceCache->BindDynamicBuffers(GetContextState(), BaseBindings);
        }
    }
    m_BindInfo.StaleSRBMask &= ~m_BindInfo.ActiveSRBMask;


#if GL_ARB_shader_image_load_store
    // Go through the list of textures bound as AUVs and set the required memory barriers
    for (TextureBaseGL* pWritableTex : m_BoundWritableTextures)
    {
        constexpr MEMORY_BARRIER TextureMemBarriers = MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= TextureMemBarriers;

        // Set new required barriers for the time when texture is used next time
        pWritableTex->SetPendingMemoryBarriers(TextureMemBarriers);
    }
    m_BoundWritableTextures.clear();

    for (BufferGLImpl* pWritableBuff : m_BoundWritableBuffers)
    {
        constexpr MEMORY_BARRIER BufferMemoryBarriers = MEMORY_BARRIER_ALL_BUFFER_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= BufferMemoryBarriers;
        // Set new required barriers for the time when buffer is used next time
        pWritableBuff->SetPendingMemoryBarriers(BufferMemoryBarriers);
    }
    m_BoundWritableBuffers.clear();
#endif
}